

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O0

ktx_error_code_e
ktxPrintKTX2InfoJSONForStdioStream
          (FILE *stdioStream,ktx_uint32_t base_indent,ktx_uint32_t indent_width,_Bool minified)

{
  undefined1 in_CL;
  undefined4 in_EDX;
  undefined4 in_ESI;
  FILE *in_RDI;
  ktxStream stream;
  ktx_error_code_e result;
  undefined1 in_stack_ffffffffffffffdf;
  undefined3 in_stack_ffffffffffffffe4;
  ktx_uint32_t base_indent_00;
  ktx_error_code_e local_4;
  
  base_indent_00 = CONCAT13(in_CL,in_stack_ffffffffffffffe4) & 0x1ffffff;
  if (in_RDI == (FILE *)0x0) {
    local_4 = KTX_INVALID_VALUE;
  }
  else {
    local_4 = ktxFileStream_construct((ktxStream *)&stack0xffffffffffffff78,in_RDI,false);
    if (local_4 == KTX_SUCCESS) {
      local_4 = ktxPrintKTX2InfoJSONForStream
                          ((ktxStream *)CONCAT44(in_ESI,in_EDX),base_indent_00,0,
                           (_Bool)in_stack_ffffffffffffffdf);
    }
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxPrintKTX2InfoJSONForStdioStream(FILE* stdioStream, ktx_uint32_t base_indent, ktx_uint32_t indent_width, bool minified)
{
    KTX_error_code result;
    ktxStream stream;

    if (stdioStream == NULL)
        return KTX_INVALID_VALUE;

    result = ktxFileStream_construct(&stream, stdioStream, KTX_FALSE);
    if (result == KTX_SUCCESS)
        result = ktxPrintKTX2InfoJSONForStream(&stream, base_indent, indent_width, minified);
    return result;
}